

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O2

void duckdb::ApplySliceRecursive
               (Vector *source_v,TupleDataVectorFormat *source_format,SelectionVector *combined_sel,
               idx_t count)

{
  SelectionVector *this;
  sel_t *__p;
  type pCVar1;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  const_reference this_01;
  type source_v_00;
  reference source_format_00;
  idx_t struct_col_idx;
  ulong __n;
  SelectionVector local_60;
  vector<duckdb::TupleDataVectorFormat,_true> *local_48;
  __shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  pCVar1 = unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>,_true>
           ::operator*(&source_format->combined_list_data);
  SelectionVector::Slice(&local_60,source_format->original_sel,(idx_t)combined_sel);
  shared_ptr<duckdb::SelectionData,_true>::operator=
            (&pCVar1->selection_data,(shared_ptr<duckdb::SelectionData,_true> *)&local_60);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60.selection_data);
  this = &(source_format->unified).owned_sel;
  ::std::__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> *)
             &pCVar1->selection_data);
  SelectionVector::Initialize(this,(buffer_ptr<SelectionData> *)&local_40);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  (source_format->unified).sel = this;
  if ((source_v->type).physical_type_ == STRUCT) {
    this_00 = StructVector::GetEntries(source_v);
    local_48 = &source_format->children;
    local_60.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)source_format;
    for (__n = 0; __n < (ulong)((long)(this_00->
                                      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ).
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this_00->
                                      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ).
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1
        ) {
      this_01 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::get<true>(this_00,__n);
      source_v_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (this_01);
      source_format_00 = vector<duckdb::TupleDataVectorFormat,_true>::get<true>(local_48,__n);
      if ((source_format_00->combined_list_data).
          super_unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::CombinedListData_*,_std::default_delete<duckdb::CombinedListData>_>
          .super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl ==
          (CombinedListData *)0x0) {
        make_uniq<duckdb::CombinedListData>();
        source_format =
             (TupleDataVectorFormat *)
             local_60.selection_data.internal.
             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        __p = local_60.sel_vector;
        local_60.sel_vector = (sel_t *)0x0;
        ::std::
        __uniq_ptr_impl<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>::
        reset((__uniq_ptr_impl<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>
               *)&source_format_00->combined_list_data,(pointer)__p);
        ::std::unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>
        ::~unique_ptr((unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>
                       *)&local_60);
      }
      ApplySliceRecursive(source_v_00,source_format_00,(source_format->unified).sel,count);
    }
  }
  return;
}

Assistant:

static void ApplySliceRecursive(const Vector &source_v, TupleDataVectorFormat &source_format,
                                const SelectionVector &combined_sel, const idx_t count) {
	D_ASSERT(source_format.combined_list_data);
	auto &combined_list_data = *source_format.combined_list_data;

	combined_list_data.selection_data = source_format.original_sel->Slice(combined_sel, count);
	source_format.unified.owned_sel.Initialize(combined_list_data.selection_data);
	source_format.unified.sel = &source_format.unified.owned_sel;

	if (source_v.GetType().InternalType() == PhysicalType::STRUCT) {
		// We have to apply it to the child vectors too
		auto &struct_sources = StructVector::GetEntries(source_v);
		for (idx_t struct_col_idx = 0; struct_col_idx < struct_sources.size(); struct_col_idx++) {
			auto &struct_source = *struct_sources[struct_col_idx];
			auto &struct_format = source_format.children[struct_col_idx];
#ifdef DEBUG
			D_ASSERT(!struct_format.combined_list_data);
#endif
			if (!struct_format.combined_list_data) {
				struct_format.combined_list_data = make_uniq<CombinedListData>();
			}
			ApplySliceRecursive(struct_source, struct_format, *source_format.unified.sel, count);
		}
	}
}